

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O0

int64_t wallet::wallet_tests::AddTx
                  (ChainstateManager *chainman,CWallet *wallet,uint32_t lockTime,int64_t mockTime,
                  int64_t blockTime)

{
  pointer ppVar1;
  pointer ppVar2;
  CWalletTx *pCVar3;
  ulong uVar4;
  long in_R8;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true>,_bool>
  pVar5;
  bool in_stack_00000016;
  bool in_stack_00000017;
  UpdateWalletTxFn *in_stack_00000018;
  TxState *in_stack_00000020;
  CTransactionRef *in_stack_00000028;
  CWallet *in_stack_00000030;
  uint256 *hash;
  CBlockIndex *block;
  CMutableTransaction tx;
  pair<std::__detail::_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true>,_bool>
  inserted;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock41;
  TxState state;
  int in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe0c;
  CMutableTransaction *in_stack_fffffffffffffe10;
  ChainstateManager *in_stack_fffffffffffffe18;
  TxStateConfirmed *in_stack_fffffffffffffe20;
  unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
  *in_stack_fffffffffffffe28;
  char *in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_fffffffffffffe48;
  uint32_t local_170;
  function<bool_(wallet::CWalletTx_&,_bool)> local_34;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction
            ((CMutableTransaction *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  TxStateInactive::TxStateInactive
            ((TxStateInactive *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),false)
  ;
  std::
  variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>
  ::variant<wallet::TxStateInactive,void,void,wallet::TxStateInactive,void>
            ((variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
              *)in_stack_fffffffffffffe18,(TxStateInactive *)in_stack_fffffffffffffe10);
  SetMockTime(CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  if (0 < in_R8) {
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)
               CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (in_stack_fffffffffffffe48,
               (AnnotatedMixin<std::recursive_mutex> *)
               CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
               in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
               (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffe28 >> 0x18,0));
    ChainstateManager::BlockIndex(in_stack_fffffffffffffe18);
    GetRandHash();
    std::make_tuple<uint256>((uint256 *)in_stack_fffffffffffffe10);
    std::make_tuple<>();
    pVar5 = std::
            unordered_map<uint256,CBlockIndex,BlockHasher,std::equal_to<uint256>,std::allocator<std::pair<uint256_const,CBlockIndex>>>
            ::emplace<std::piecewise_construct_t_const&,std::tuple<uint256>,std::tuple<>>
                      (in_stack_fffffffffffffe28,(piecewise_construct_t *)in_stack_fffffffffffffe20,
                       (tuple<uint256> *)in_stack_fffffffffffffe18,
                       (tuple<> *)in_stack_fffffffffffffe10);
    if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __assert_fail("inserted.second",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                    ,0x195,
                    "int64_t wallet::wallet_tests::AddTx(ChainstateManager &, CWallet &, uint32_t, int64_t, int64_t)"
                   );
    }
    ppVar1 = std::__detail::_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true>::
             operator->((_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true> *)
                        CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    ppVar2 = std::__detail::_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true>::
             operator->((_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true> *)
                        CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    local_170 = (uint32_t)in_R8;
    (ppVar2->second).nTime = local_170;
    (ppVar2->second).phashBlock = &ppVar1->first;
    TxStateConfirmed::TxStateConfirmed
              ((TxStateConfirmed *)in_stack_fffffffffffffe18,(uint256 *)in_stack_fffffffffffffe10,
               in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08);
    std::
    variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>
    ::operator=((variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                 *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  }
  MakeTransactionRef<CMutableTransaction&>(in_stack_fffffffffffffe10);
  std::function<bool(wallet::CWalletTx&,bool)>::
  function<wallet::wallet_tests::AddTx(ChainstateManager&,wallet::CWallet&,unsigned_int,long,long)::__0,void>
            (&local_34,(anon_class_8_1_a8a4b3b1 *)in_stack_fffffffffffffe10);
  pCVar3 = CWallet::AddToWallet
                     (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018,
                      in_stack_00000017,in_stack_00000016);
  uVar4 = (ulong)pCVar3->nTimeSmart;
  std::function<bool_(wallet::CWalletTx_&,_bool)>::~function
            ((function<bool_(wallet::CWalletTx_&,_bool)> *)
             CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)
             CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  CMutableTransaction::~CMutableTransaction
            ((CMutableTransaction *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return uVar4;
  }
  __stack_chk_fail();
}

Assistant:

static int64_t AddTx(ChainstateManager& chainman, CWallet& wallet, uint32_t lockTime, int64_t mockTime, int64_t blockTime)
{
    CMutableTransaction tx;
    TxState state = TxStateInactive{};
    tx.nLockTime = lockTime;
    SetMockTime(mockTime);
    CBlockIndex* block = nullptr;
    if (blockTime > 0) {
        LOCK(cs_main);
        auto inserted = chainman.BlockIndex().emplace(std::piecewise_construct, std::make_tuple(GetRandHash()), std::make_tuple());
        assert(inserted.second);
        const uint256& hash = inserted.first->first;
        block = &inserted.first->second;
        block->nTime = blockTime;
        block->phashBlock = &hash;
        state = TxStateConfirmed{hash, block->nHeight, /*index=*/0};
    }
    return wallet.AddToWallet(MakeTransactionRef(tx), state, [&](CWalletTx& wtx, bool /* new_tx */) {
        // Assign wtx.m_state to simplify test and avoid the need to simulate
        // reorg events. Without this, AddToWallet asserts false when the same
        // transaction is confirmed in different blocks.
        wtx.m_state = state;
        return true;
    })->nTimeSmart;
}